

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O1

mat<2UL,_2UL> * __thiscall
mat<3UL,_3UL>::get_minor
          (mat<2UL,_2UL> *__return_storage_ptr__,mat<3UL,_3UL> *this,size_t row,size_t col)

{
  ulong uVar1;
  double dVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong i;
  
  __return_storage_ptr__->rows[1].x = 0.0;
  __return_storage_ptr__->rows[1].y = 0.0;
  __return_storage_ptr__->rows[0].x = 0.0;
  __return_storage_ptr__->rows[0].y = 0.0;
  uVar5 = 1;
  uVar4 = 2;
  do {
    uVar3 = uVar5;
    if (uVar3 < row) {
      uVar4 = uVar3;
    }
    uVar5 = 2;
    do {
      uVar1 = uVar5 - 1;
      i = uVar5;
      if (uVar1 < col) {
        i = uVar1;
      }
      dVar2 = vec<3UL,_double>::operator[](this->rows + uVar4,i);
      (&__return_storage_ptr__->rows[uVar3].x)[uVar5 != 1] = dVar2;
      uVar5 = uVar1;
    } while (uVar1 != 0);
    uVar5 = uVar3 - 1;
    uVar4 = uVar3;
  } while (uVar3 != 0);
  return __return_storage_ptr__;
}

Assistant:

mat<nrows - 1, ncols - 1> get_minor(const size_t row, const size_t col) const
    {
        mat<nrows - 1, ncols - 1> ret;
        for (size_t i = nrows - 1; i--;)
            for (size_t j = ncols - 1; j--;
                 ret[i][j] = rows[i < row ? i : i + 1][j < col ? j : j + 1])
                ;
        return ret;
    }